

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall qpdf::Tokenizer::Tokenizer(Tokenizer *this)

{
  this->allow_eof = false;
  this->include_ignorable = false;
  (this->val)._M_dataplus._M_p = (pointer)&(this->val).field_2;
  (this->val)._M_string_length = 0;
  (this->val).field_2._M_local_buf[0] = '\0';
  (this->raw_val)._M_dataplus._M_p = (pointer)&(this->raw_val).field_2;
  (this->raw_val)._M_string_length = 0;
  (this->raw_val).field_2._M_local_buf[0] = '\0';
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  reset(this);
  return;
}

Assistant:

Tokenizer::Tokenizer()
{
    reset();
}